

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> * __thiscall
openjij::system::make_classical_ising_polynomial<openjij::graph::Polynomial<double>>
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *__return_storage_ptr__,
          system *this,Spins *init_variables,Polynomial<double> *poly_graph,string *init_vartype)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)poly_graph);
  ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ClassicalIsingPolynomial
            (__return_storage_ptr__,(Spins *)this,(Polynomial<double> *)init_variables,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

auto make_classical_ising_polynomial(const graph::Spins &init_variables,
                                     const GraphType &poly_graph,
                                     const std::string init_vartype) {
  return ClassicalIsingPolynomial<graph::Polynomial<double>>(
      init_variables, poly_graph, init_vartype);
}